

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_install_info.cpp
# Opt level: O0

string * __thiscall
duckdb::ExtensionRepository::ToReadableString_abi_cxx11_(ExtensionRepository *this)

{
  ulong uVar1;
  string *in_RSI;
  string *in_RDI;
  
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    ::std::__cxx11::string::string((string *)in_RDI,in_RSI);
  }
  else {
    ::std::__cxx11::string::string((string *)in_RDI,in_RSI + 0x20);
  }
  return in_RDI;
}

Assistant:

string ExtensionRepository::ToReadableString() {
	if (!name.empty()) {
		return name;
	}
	return path;
}